

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall
Encoder::ValidateCRCOnFinalBuffer
          (Encoder *this,BYTE *finalCodeBufferStart,size_t finalCodeSize,size_t jumpTableSize,
          BYTE *oldCodeBufferStart,uint initialCrcSeed,uint bufferCrcToValidate,
          BOOL isSuccessBrShortAndLoopAlign)

{
  RelocList *pRVar1;
  code *pcVar2;
  BYTE *pBVar3;
  bool bVar4;
  uint uVar5;
  Type *reloc;
  BYTE *pBVar6;
  undefined4 *puVar7;
  uint uVar8;
  BYTE *pBVar9;
  EncoderMD *pEVar10;
  int index;
  size_t count;
  uint local_8c;
  BYTE *local_88;
  BYTE *local_80;
  long local_78;
  size_t local_70;
  EncoderMD *local_68;
  uint local_5c;
  BYTE *local_58;
  BYTE *local_50;
  List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_48;
  undefined4 *local_40;
  BYTE *local_38;
  
  pRVar1 = (this->m_encoderMD).m_relocList;
  pEVar10 = &this->m_encoderMD;
  local_78 = finalCodeSize - jumpTableSize;
  local_70 = finalCodeSize;
  local_58 = oldCodeBufferStart;
  local_50 = finalCodeBufferStart;
  local_38 = finalCodeBufferStart;
  if ((pRVar1 != (RelocList *)0x0) &&
     (0 < (pRVar1->super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
          ).count)) {
    local_88 = oldCodeBufferStart + local_78;
    local_80 = finalCodeBufferStart + local_78;
    index = 0;
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pBVar9 = (BYTE *)0x0;
    local_68 = pEVar10;
    local_48 = pRVar1;
    do {
      pEVar10 = local_68;
      reloc = JsUtil::
              List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(local_48,index);
      pBVar6 = EncoderMD::GetRelocBufferAddress(pEVar10,reloc);
      if ((local_58 <= pBVar6) &&
         (pBVar6 = EncoderMD::GetRelocBufferAddress(pEVar10,reloc), pBVar6 < local_88)) {
        pBVar6 = EncoderMD::GetRelocBufferAddress(pEVar10,reloc);
        pBVar6 = local_50 + ((long)pBVar6 - (long)local_58);
        if (pBVar6 < local_50 || local_80 <= pBVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x42b,
                             "(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable))"
                             ,
                             "finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable)"
                            );
          if (!bVar4) goto LAB_0040a377;
          *local_40 = 0;
        }
        uVar5 = EncoderMD::GetRelocDataSize(local_68,reloc);
        pBVar3 = local_38;
        if (uVar5 != 0) {
          local_5c = uVar5;
          if (pBVar6 <= pBVar9 && pBVar9 != (BYTE *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = local_40;
            *local_40 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x42f,"(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr)",
                               "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress"
                              );
            if (!bVar4) goto LAB_0040a377;
            *puVar7 = 0;
          }
          pBVar9 = pBVar3;
          if (pBVar6 < pBVar3) {
            AssertCount = AssertCount + 1;
            local_38 = pBVar3;
            Js::Throw::LogAssert();
            puVar7 = local_40;
            *local_40 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x435,"(currentEndAddress >= currentStartAddress)",
                               "currentEndAddress >= currentStartAddress");
            if (!bVar4) goto LAB_0040a377;
            *puVar7 = 0;
            pBVar9 = local_38;
          }
          initialCrcSeed = CalculateCRC(initialCrcSeed,(long)pBVar6 - (long)pBVar3,pBVar9);
          uVar5 = local_5c;
          uVar8 = local_5c;
          do {
            initialCrcSeed = CalculateCRC(initialCrcSeed,0);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
          local_38 = pBVar6 + uVar5;
          pBVar9 = pBVar6;
        }
      }
      index = index + 1;
      pEVar10 = local_68;
    } while (index < (local_48->
                     super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  count = (long)(local_50 + local_78) - (long)local_38;
  if (local_50 + local_78 < local_38) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x445,"(currentEndAddress >= currentStartAddress)",
                       "currentEndAddress >= currentStartAddress");
    if (!bVar4) goto LAB_0040a377;
    *puVar7 = 0;
  }
  local_8c = CalculateCRC(initialCrcSeed,count,local_38);
  EncoderMD::ApplyRelocs
            (pEVar10,(size_t)local_50,local_70,&local_8c,isSuccessBrShortAndLoopAlign,true);
  if (local_8c == bufferCrcToValidate) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar7 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                     ,0x44e,"(false)","false");
  if (bVar4) {
    *puVar7 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_0040a377:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void Encoder::ValidateCRCOnFinalBuffer(_In_reads_bytes_(finalCodeSize) BYTE * finalCodeBufferStart, size_t finalCodeSize, size_t jumpTableSize, _In_reads_bytes_(finalCodeSize) BYTE * oldCodeBufferStart, uint initialCrcSeed, uint bufferCrcToValidate, BOOL isSuccessBrShortAndLoopAlign)
{
    RelocList * relocList = m_encoderMD.GetRelocList();

    BYTE * currentStartAddress = finalCodeBufferStart;
    BYTE * currentEndAddress = nullptr;
    size_t crcSizeToCompute = 0;

    size_t finalCodeSizeWithoutJumpTable = finalCodeSize - jumpTableSize;

    uint finalBufferCRC = initialCrcSeed;

    BYTE * oldPtr = nullptr;

    if (relocList != nullptr)
    {
        for (int index = 0; index < relocList->Count(); index++)
        {
            EncodeRelocAndLabels * relocTuple = &relocList->Item(index);

            //We will deal with the jump table and dictionary entries along with other reloc records in ApplyRelocs()
            if ((BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) >= oldCodeBufferStart && (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) < (oldCodeBufferStart + finalCodeSizeWithoutJumpTable))
            {
                BYTE* finalBufferRelocTuplePtr = (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) - oldCodeBufferStart + finalCodeBufferStart;
                Assert(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable));
                uint relocDataSize = m_encoderMD.GetRelocDataSize(relocTuple);
                if (relocDataSize != 0)
                {
                    AssertMsg(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr, "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress");
                    oldPtr = finalBufferRelocTuplePtr;

                    currentEndAddress = finalBufferRelocTuplePtr;
                    crcSizeToCompute = currentEndAddress - currentStartAddress;

                    Assert(currentEndAddress >= currentStartAddress);

                    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);
                    for (uint i = 0; i < relocDataSize; i++)
                    {
                        finalBufferCRC = CalculateCRC(finalBufferCRC, 0);
                    }
                    currentStartAddress = currentEndAddress + relocDataSize;
                }
            }
        }
    }

    currentEndAddress = finalCodeBufferStart + finalCodeSizeWithoutJumpTable;
    crcSizeToCompute = currentEndAddress - currentStartAddress;

    Assert(currentEndAddress >= currentStartAddress);

    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);

    //Include all offsets from the reloc records to the CRC.
    m_encoderMD.ApplyRelocs((size_t)finalCodeBufferStart, finalCodeSize, &finalBufferCRC, isSuccessBrShortAndLoopAlign, true);

    if (finalBufferCRC != bufferCrcToValidate)
    {
        Assert(false);
        Fatal();
    }
}